

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O3

double __thiscall Tank::findHead(Tank *this,double aVolume)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  if (this->volCurve == (Curve *)0x0) {
    dVar2 = aVolume - this->minVolume;
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    dVar3 = this->minHead;
    pdVar1 = &this->area;
  }
  else {
    pdVar1 = &this->ucfLength;
    dVar3 = (this->super_Node).elev;
    dVar2 = this->ucfLength;
    dVar2 = Curve::getXofY(this->volCurve,dVar2 * dVar2 * dVar2 * aVolume);
  }
  return dVar2 / *pdVar1 + dVar3;
}

Assistant:

double Tank::findHead(double aVolume)
{
    // ... tank has a volume curve (in original user units)

    if ( volCurve )
    {
        double ucfArea = ucfLength * ucfLength;
        aVolume *= ucfArea * ucfLength;
        return elev + volCurve->getXofY(aVolume) / ucfLength;
    }

    // ... tank is cylindrical

    else
    {
        aVolume = max(0.0, aVolume - minVolume);
        return minHead + aVolume / area;
    }
}